

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void write_ttymodes_to_packet(long bs,int ssh_version)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar2 = (uint)(ssh_version == 1) * 0x40;
  lVar4 = 0;
  do {
    if ((&stack0x00000008)[lVar4] == '\x01') {
      uVar3 = (uint)lVar4;
      uVar1 = uVar2 | 0x80;
      if ((uVar3 != 0x100) && (uVar1 = uVar3, uVar3 == 0x101)) {
        uVar1 = uVar2 + 0x81;
      }
      uVar3 = *(uint *)(&stack0x0000010c + lVar4 * 4);
      BinarySink_put_byte(*(BinarySink **)(bs + 0x10),(uchar)uVar1);
      if ((ssh_version == 1) && (uVar1 - 1 < 0x7f)) {
        BinarySink_put_byte(*(BinarySink **)(bs + 0x10),(uchar)uVar3);
      }
      else {
        BinarySink_put_uint32(*(BinarySink **)(bs + 0x10),(ulong)uVar3);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x102);
  BinarySink_put_byte(*(BinarySink **)(bs + 0x10),'\0');
  return;
}

Assistant:

void write_ttymodes_to_packet(BinarySink *bs, int ssh_version,
                              struct ssh_ttymodes modes)
{
    unsigned i;

    for (i = 0; i < TTYMODE_LIMIT; i++) {
        if (modes.have_mode[i]) {
            unsigned val = modes.mode_val[i];
            unsigned opcode = real_ttymode_opcode(i, ssh_version);

            put_byte(bs, opcode);
            if (ssh_version == 1 && opcode >= 1 && opcode <= 127)
                put_byte(bs, val);
            else
                put_uint32(bs, val);
        }
    }

    put_byte(bs, TTYMODE_END_OF_LIST);
}